

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

any __thiscall
cs_impl::
cni_helper<unsigned_long_(*)(const_cs_impl::any_&),_unsigned_long_(*)(const_cs_impl::any_&)>::call
          (cni_helper<unsigned_long_(*)(const_cs_impl::any_&),_unsigned_long_(*)(const_cs_impl::any_&)>
           *this,vector *args)

{
  size_type sVar1;
  string *str;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  cni_helper<unsigned_long_(*)(const_cs_impl::any_&),_unsigned_long_(*)(const_cs_impl::any_&)>
  *in_RSI;
  runtime_error *in_RDI;
  unsigned_long *in_stack_ffffffffffffff08;
  runtime_error *args_00;
  any *in_stack_ffffffffffffff40;
  any *in_stack_ffffffffffffff48;
  
  args_00 = in_RDI;
  sVar1 = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDX);
  if (sVar1 != 1) {
    str = (string *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff48);
    std::operator+((char *)args_00,(any *)in_RDI);
    std::operator+((any *)args_00,(char *)in_RDI);
    std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::size(in_RDX);
    std::__cxx11::to_string((unsigned_long)in_stack_ffffffffffffff48);
    std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    cs::runtime_error::runtime_error(in_RDI,str);
    __cxa_throw(str,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
  _call<0>(in_RSI,(vector *)args_00,(sequence<0> *)in_RDI);
  return_to_cs<unsigned_long>(in_stack_ffffffffffffff08);
  return (any)(proxy *)args_00;
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			return return_to_cs(_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result));
		}